

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterListToPMA(SortSubtask *pTask,SorterList *pList)

{
  sqlite3 *db;
  SorterRecord *pSVar1;
  int iVar2;
  sqlite3_file *pFd;
  SorterRecord *p;
  PmaWriter writer;
  PmaWriter local_58;
  
  db = pTask->pSorter->db;
  local_58.iWriteOff = 0;
  local_58.pFd = (sqlite3_file *)0x0;
  local_58.nBuffer = 0;
  local_58.iBufStart = 0;
  local_58.iBufEnd = 0;
  local_58._28_4_ = 0;
  local_58.eFWErr = 0;
  local_58._4_4_ = 0;
  local_58.aBuffer = (u8 *)0x0;
  pFd = (pTask->file).pFd;
  if (pFd == (sqlite3_file *)0x0) {
    iVar2 = vdbeSorterOpenTempFile(db,0,&(pTask->file).pFd);
    if (iVar2 != 0) {
      return iVar2;
    }
    pFd = (pTask->file).pFd;
  }
  vdbeSorterExtendFile(db,pFd,(pTask->file).iEof + (long)pList->szPMA + 9);
  iVar2 = vdbeSorterSort(pTask,pList);
  if (iVar2 == 0) {
    vdbePmaWriterInit((pTask->file).pFd,&local_58,pTask->pSorter->pgsz,(pTask->file).iEof);
    pTask->nPMA = pTask->nPMA + 1;
    vdbePmaWriteVarint(&local_58,(long)pList->szPMA);
    pSVar1 = pList->pList;
    while (p = pSVar1, p != (SorterRecord *)0x0) {
      pSVar1 = (p->u).pNext;
      vdbePmaWriteVarint(&local_58,(long)p->nVal);
      vdbePmaWriteBlob(&local_58,(u8 *)(p + 1),p->nVal);
      if (pList->aMemory == (u8 *)0x0) {
        sqlite3_free(p);
      }
    }
    pList->pList = (SorterRecord *)0x0;
    iVar2 = vdbePmaWriterFinish(&local_58,&(pTask->file).iEof);
  }
  return iVar2;
}

Assistant:

static int vdbeSorterListToPMA(SortSubtask *pTask, SorterList *pList){
  sqlite3 *db = pTask->pSorter->db;
  int rc = SQLITE_OK;             /* Return code */
  PmaWriter writer;               /* Object used to write to the file */

#ifdef SQLITE_DEBUG
  /* Set iSz to the expected size of file pTask->file after writing the PMA.
  ** This is used by an assert() statement at the end of this function.  */
  i64 iSz = pList->szPMA + sqlite3VarintLen(pList->szPMA) + pTask->file.iEof;
#endif

  vdbeSorterWorkDebug(pTask, "enter");
  memset(&writer, 0, sizeof(PmaWriter));
  assert( pList->szPMA>0 );

  /* If the first temporary PMA file has not been opened, open it now. */
  if( pTask->file.pFd==0 ){
    rc = vdbeSorterOpenTempFile(db, 0, &pTask->file.pFd);
    assert( rc!=SQLITE_OK || pTask->file.pFd );
    assert( pTask->file.iEof==0 );
    assert( pTask->nPMA==0 );
  }

  /* Try to get the file to memory map */
  if( rc==SQLITE_OK ){
    vdbeSorterExtendFile(db, pTask->file.pFd, pTask->file.iEof+pList->szPMA+9);
  }

  /* Sort the list */
  if( rc==SQLITE_OK ){
    rc = vdbeSorterSort(pTask, pList);
  }

  if( rc==SQLITE_OK ){
    SorterRecord *p;
    SorterRecord *pNext = 0;

    vdbePmaWriterInit(pTask->file.pFd, &writer, pTask->pSorter->pgsz,
                      pTask->file.iEof);
    pTask->nPMA++;
    vdbePmaWriteVarint(&writer, pList->szPMA);
    for(p=pList->pList; p; p=pNext){
      pNext = p->u.pNext;
      vdbePmaWriteVarint(&writer, p->nVal);
      vdbePmaWriteBlob(&writer, SRVAL(p), p->nVal);
      if( pList->aMemory==0 ) sqlite3_free(p);
    }
    pList->pList = p;
    rc = vdbePmaWriterFinish(&writer, &pTask->file.iEof);
  }

  vdbeSorterWorkDebug(pTask, "exit");
  assert( rc!=SQLITE_OK || pList->pList==0 );
  assert( rc!=SQLITE_OK || pTask->file.iEof==iSz );
  return rc;
}